

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functor.hpp
# Opt level: O0

void __thiscall
Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>
::Functor(Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>
          *this)

{
  vector<double,_std::allocator<double>_> local_48;
  function<double_(const_double_&)> local_30;
  Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>
  *local_10;
  Functor<const_std::function<double_(const_double_&)>,_const_std::vector<double,_std::allocator<double>_>,_const_void>
  *this_local;
  
  local_10 = this;
  std::function<double_(const_double_&)>::function(&local_30);
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector(&local_48);
  Functor(this,&local_30,&local_48,(cpTo)0x0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_48);
  std::function<double_(const_double_&)>::~function(&local_30);
  return;
}

Assistant:

Functor() : Functor(Tf{}, Tp{}) {}